

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void fielddesc_setfloat_var(_fielddesc *fd,t_symbol *s)

{
  char *pcVar1;
  char *__s;
  t_symbol *ptVar2;
  double local_450;
  double quantum;
  double screen2;
  double screen1;
  double v2;
  double v1;
  int local_420;
  int got;
  int cpy;
  int i;
  char strbuf [1000];
  char *s3;
  char *s2;
  char *s1;
  t_symbol *s_local;
  _fielddesc *fd_local;
  
  fd->fd_type = '\x01';
  fd->fd_var = '\x01';
  pcVar1 = strchr(s->s_name,0x28);
  if (((pcVar1 == (char *)0x0) || (__s = strchr(s->s_name,0x29), __s == (char *)0x0)) ||
     (__s < pcVar1)) {
    (fd->fd_un).fd_symbol = s;
    fd->fd_quantum = 0.0;
    fd->fd_screen2 = 0.0;
    fd->fd_screen1 = 0.0;
    fd->fd_v2 = 0.0;
    fd->fd_v1 = 0.0;
  }
  else {
    local_420 = (int)pcVar1 - (int)s->s_name;
    if (0x3e3 < local_420) {
      local_420 = 0x3e3;
    }
    strncpy((char *)&cpy,s->s_name,(long)local_420);
    *(undefined1 *)((long)&cpy + (long)local_420) = 0;
    ptVar2 = gensym((char *)&cpy);
    (fd->fd_un).fd_symbol = ptVar2;
    v1._4_4_ = __isoc99_sscanf(pcVar1,"(%lf:%lf)(%lf:%lf)(%lf)",&v2,&screen1,&screen2,&quantum,
                               &local_450);
    fd->fd_v1 = (float)v2;
    fd->fd_v2 = (float)screen1;
    fd->fd_screen1 = (float)screen2;
    fd->fd_screen2 = (float)quantum;
    fd->fd_quantum = (float)local_450;
    if ((((v1._4_4_ < 2) || (v1._4_4_ == 3)) ||
        ((v1._4_4_ < 4 && (pcVar1 = strchr(__s,0x28), pcVar1 != (char *)0x0)))) ||
       (((v1._4_4_ < 5 && (strbuf._992_8_ = strchr(__s,0x28), (char *)strbuf._992_8_ != (char *)0x0)
         ) && (pcVar1 = strchr((char *)(strbuf._992_8_ + 1),0x28), pcVar1 != (char *)0x0)))) {
      post("parse error: %s",s->s_name);
      fd->fd_quantum = 0.0;
      fd->fd_screen2 = 0.0;
      fd->fd_v2 = 0.0;
      fd->fd_screen1 = 0.0;
      fd->fd_v1 = 0.0;
    }
    else if (v1._4_4_ == 4) {
      fd->fd_quantum = 0.0;
    }
    else if (v1._4_4_ == 2) {
      fd->fd_quantum = 0.0;
      fd->fd_screen1 = fd->fd_v1;
      fd->fd_screen2 = fd->fd_v2;
    }
  }
  return;
}

Assistant:

static void fielddesc_setfloat_var(t_fielddesc *fd, t_symbol *s)
{
    char *s1, *s2, *s3, strbuf[MAXPDSTRING];
    int i;
    fd->fd_type = A_FLOAT;
    fd->fd_var = 1;
    if (!(s1 = strchr(s->s_name, '(')) || !(s2 = strchr(s->s_name, ')'))
        || (s1 > s2))
    {
        fd->fd_un.fd_varsym = s;
        fd->fd_v1 = fd->fd_v2 = fd->fd_screen1 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
    else
    {
        int cpy = (int)(s1 - s->s_name), got;
        double v1, v2, screen1, screen2, quantum;
        if (cpy > MAXPDSTRING-5)
            cpy = MAXPDSTRING-5;
        strncpy(strbuf, s->s_name, cpy);
        strbuf[cpy] = 0;
        fd->fd_un.fd_varsym = gensym(strbuf);
        got = sscanf(s1, "(%lf:%lf)(%lf:%lf)(%lf)",
            &v1, &v2, &screen1, &screen2,
                &quantum);
        fd->fd_v1=v1;
        fd->fd_v2=v2;
        fd->fd_screen1=screen1;
        fd->fd_screen2=screen2;
        fd->fd_quantum=quantum;
        if (got < 2)
            goto fail;
        if (got == 3 || (got < 4 && strchr(s2, '(')))
            goto fail;
        if (got < 5 && (s3 = strchr(s2, '(')) && strchr(s3+1, '('))
            goto fail;
        if (got == 4)
            fd->fd_quantum = 0;
        else if (got == 2)
        {
            fd->fd_quantum = 0;
            fd->fd_screen1 = fd->fd_v1;
            fd->fd_screen2 = fd->fd_v2;
        }
        return;
    fail:
        post("parse error: %s", s->s_name);
        fd->fd_v1 = fd->fd_screen1 = fd->fd_v2 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
}